

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.h
# Opt level: O2

int __thiscall
google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(CodedInputStream *this)

{
  byte bVar1;
  byte *pbVar2;
  uint uVar3;
  byte *pbVar4;
  ulong uVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  pair<unsigned_long,_bool> pVar10;
  
  pbVar2 = this->buffer_;
  pbVar4 = this->buffer_end_;
  if (((int)pbVar4 - (int)pbVar2 < 10) && ((pbVar4 <= pbVar2 || ((char)pbVar4[-1] < '\0')))) {
    pVar10 = ReadVarint64Fallback(this);
    uVar3 = (uint)pVar10.first | -(uint)(pVar10.first >> 0x1f != 0);
    if (((undefined1  [16])pVar10 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      uVar3 = 0xffffffff;
    }
    return uVar3;
  }
  bVar1 = *pbVar2;
  uVar6 = (uint)bVar1;
  uVar5 = 0;
  uVar3 = 0xffffffff;
  if ((char)bVar1 < '\0') {
    uVar6 = ((uint)bVar1 + (uint)pbVar2[1] * 0x80) - 0x80;
    if ((char)pbVar2[1] < '\0') {
      uVar6 = (uVar6 + (uint)pbVar2[2] * 0x4000) - 0x4000;
      if ((char)pbVar2[2] < '\0') {
        iVar7 = uVar6 + (uint)pbVar2[3] * 0x200000;
        uVar6 = iVar7 - 0x200000;
        if ((char)pbVar2[3] < '\0') {
          uVar6 = iVar7 + 0xefe00000;
          bVar1 = pbVar2[4];
          uVar9 = (ulong)bVar1;
          if ((char)bVar1 < '\0') {
            uVar8 = ((uint)bVar1 + (uint)pbVar2[5] * 0x80) - 0x80;
            uVar9 = (ulong)uVar8;
            if ((char)pbVar2[5] < '\0') {
              uVar8 = (uVar8 + (uint)pbVar2[6] * 0x4000) - 0x4000;
              uVar9 = (ulong)uVar8;
              if ((char)pbVar2[6] < '\0') {
                iVar7 = uVar8 + (uint)pbVar2[7] * 0x200000;
                uVar9 = (ulong)(iVar7 - 0x200000);
                if ((char)pbVar2[7] < '\0') {
                  uVar9 = (ulong)(iVar7 + 0xefe00000);
                  bVar1 = pbVar2[8];
                  uVar5 = (ulong)bVar1;
                  if ((char)bVar1 < '\0') {
                    if ((char)pbVar2[9] < '\0') {
                      return -1;
                    }
                    pbVar4 = pbVar2 + 10;
                    uVar5 = (ulong)(((uint)bVar1 + (uint)pbVar2[9] * 0x80) - 0x80);
                  }
                  else {
                    pbVar4 = pbVar2 + 9;
                  }
                }
                else {
                  pbVar4 = pbVar2 + 8;
                }
              }
              else {
                pbVar4 = pbVar2 + 7;
              }
            }
            else {
              pbVar4 = pbVar2 + 6;
            }
          }
          else {
            pbVar4 = pbVar2 + 5;
          }
          goto LAB_002c8d81;
        }
        pbVar4 = pbVar2 + 4;
      }
      else {
        pbVar4 = pbVar2 + 3;
      }
    }
    else {
      pbVar4 = pbVar2 + 2;
    }
  }
  else {
    pbVar4 = pbVar2 + 1;
  }
  uVar9 = 0;
LAB_002c8d81:
  if ((uVar5 << 0x38 | uVar9 << 0x1c | (ulong)uVar6) < 0x80000000) {
    this->buffer_ = pbVar4;
    uVar3 = (uint)(uVar9 << 0x1c) | uVar6;
  }
  return uVar3;
}

Assistant:

inline int CodedInputStream::BufferSize() const {
  return static_cast<int>(buffer_end_ - buffer_);
}